

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

void __thiscall PSEngine::load_next_level(PSEngine *this)

{
  int iVar1;
  allocator<char> local_61;
  string local_60;
  Operation op;
  
  iVar1 = (this->m_current_level).level_idx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  Operation::Operation(&op,LoadLevel,None,-1,&local_60);
  iVar1 = iVar1 + 1;
  std::__cxx11::string::~string((string *)&local_60);
  op.loaded_level = iVar1;
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
            (&this->m_operation_history,&op);
  load_level_internal(this,iVar1);
  std::__cxx11::string::~string((string *)&op.loaded_game_title);
  return;
}

Assistant:

void PSEngine::load_next_level()
{
    int next_level_idx = m_current_level.level_idx + 1;

    Operation op = Operation(OperationType::LoadLevel);
    op.loaded_level = next_level_idx;
    m_operation_history.push_back(op);

    load_level_internal(next_level_idx);
}